

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

void __thiscall
vkt::BindingModel::anon_unknown_1::SingleCmdRenderInstance::renderToTarget
          (SingleCmdRenderInstance *this)

{
  byte bVar1;
  DeviceInterface *pDVar2;
  VkDevice pVVar3;
  VkCommandBuffer_s *pVVar4;
  VkQueue pVVar5;
  RefData<vk::Handle<(vk::HandleType)18>_> data;
  RefData<vk::VkCommandBuffer_s_*> data_00;
  RefData<vk::VkCommandBuffer_s_*> data_01;
  RefData<vk::Handle<(vk::HandleType)6>_> data_02;
  uint uVar6;
  uint uVar7;
  VkResult VVar8;
  Handle<(vk::HandleType)17> *pHVar9;
  Handle<(vk::HandleType)23> *pHVar10;
  undefined4 extraout_var;
  Handle<(vk::HandleType)24> *pHVar11;
  VkCommandBuffer_s **ppVVar12;
  Handle<(vk::HandleType)18> *pHVar13;
  Handle<(vk::HandleType)6> *pHVar14;
  UVec2 *this_00;
  Unique<vk::Handle<(vk::HandleType)17>_> *this_01;
  Unique<vk::Handle<(vk::HandleType)23>_> *this_02;
  undefined8 uStack_308;
  VkSubmitInfo submitInfo;
  VkSubpassContents passContents;
  deUint64 infiniteTimeout;
  RefData<vk::Handle<(vk::HandleType)6>_> local_280;
  undefined1 local_260 [8];
  Unique<vk::Handle<(vk::HandleType)6>_> fence;
  Move<vk::VkCommandBuffer_s_*> local_238;
  RefData<vk::VkCommandBuffer_s_*> local_218;
  undefined1 local_1f8 [8];
  Unique<vk::VkCommandBuffer_s_*> passCmd;
  Move<vk::VkCommandBuffer_s_*> local_1d0;
  RefData<vk::VkCommandBuffer_s_*> local_1b0;
  undefined1 local_190 [8];
  Unique<vk::VkCommandBuffer_s_*> mainCmd;
  Move<vk::Handle<(vk::HandleType)18>_> local_158;
  RefData<vk::Handle<(vk::HandleType)18>_> local_138;
  undefined1 local_118 [8];
  Unique<vk::Handle<(vk::HandleType)18>_> pipeline;
  VkPipelineLayout pipelineLayout;
  VkRenderPassBeginInfo renderPassBeginInfo;
  VkClearValue clearValue;
  VkCommandBufferBeginInfo passCmdBufBeginInfo;
  VkCommandBufferInheritanceInfo passCmdBufInheritInfo;
  VkCommandBufferBeginInfo mainCmdBufBeginInfo;
  VkRect2D renderArea;
  SingleCmdRenderInstance *this_local;
  
  this_00 = &(this->super_SingleTargetRenderInstance).m_targetSize;
  uVar6 = tcu::Vector<unsigned_int,_2>::x(this_00);
  uVar7 = tcu::Vector<unsigned_int,_2>::y(this_00);
  passCmdBufInheritInfo.pipelineStatistics = 0x2a;
  passCmdBufInheritInfo._52_4_ = 0;
  passCmdBufBeginInfo.pInheritanceInfo._0_4_ = 0x29;
  passCmdBufInheritInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  passCmdBufInheritInfo._4_4_ = 0;
  this_01 = &(this->super_SingleTargetRenderInstance).m_renderPass;
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                     (&this_01->super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  passCmdBufInheritInfo.pNext = (void *)pHVar9->m_internal;
  passCmdBufInheritInfo.renderPass.m_internal._0_4_ = 0;
  this_02 = &(this->super_SingleTargetRenderInstance).m_framebuffer;
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::operator*
                      (&this_02->super_RefBase<vk::Handle<(vk::HandleType)23>_>);
  passCmdBufInheritInfo._24_8_ = pHVar10->m_internal;
  passCmdBufInheritInfo.framebuffer.m_internal._0_4_ = 0;
  passCmdBufInheritInfo.framebuffer.m_internal._4_4_ = 0;
  passCmdBufInheritInfo.occlusionQueryEnable = 0;
  clearValue._8_4_ = 0x2a;
  passCmdBufBeginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  passCmdBufBeginInfo._4_4_ = 0;
  passCmdBufBeginInfo.pNext._0_4_ = 3;
  passCmdBufBeginInfo._16_8_ = &passCmdBufBeginInfo.pInheritanceInfo;
  join_0x00000010_0x00000000_ = ::vk::makeClearValueColorF32(0.0,0.0,0.0,0.0);
  pipelineLayout.m_internal._0_4_ = 0x2b;
  renderPassBeginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassBeginInfo._4_4_ = 0;
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                     (&this_01->super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  renderPassBeginInfo.pNext = (void *)pHVar9->m_internal;
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::operator*
                      (&this_02->super_RefBase<vk::Handle<(vk::HandleType)23>_>);
  renderPassBeginInfo.renderPass.m_internal = pHVar10->m_internal;
  renderPassBeginInfo.framebuffer.m_internal._0_4_ = 0;
  renderPassBeginInfo.framebuffer.m_internal._4_4_ = 0;
  renderPassBeginInfo.renderArea.extent.width = 1;
  renderPassBeginInfo._48_8_ = &renderPassBeginInfo.pClearValues;
  renderPassBeginInfo.renderArea.offset.x = uVar6;
  renderPassBeginInfo.renderArea.offset.y = uVar7;
  pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator._0_4_ =
       (*(this->super_SingleTargetRenderInstance).super_TestInstance._vptr_TestInstance[6])();
  pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator._4_4_ =
       extraout_var;
  createPipeline(&local_158,this,
                 (VkPipelineLayout)
                 pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator)
  ;
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_138,(Move *)&local_158);
  data.deleter.m_deviceIface = local_138.deleter.m_deviceIface;
  data.object.m_internal = local_138.object.m_internal;
  data.deleter.m_device = local_138.deleter.m_device;
  data.deleter.m_allocator = local_138.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_118,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_158);
  pDVar2 = (this->super_SingleTargetRenderInstance).m_vki;
  pVVar3 = (this->super_SingleTargetRenderInstance).m_device;
  pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                      (&(this->super_SingleTargetRenderInstance).m_cmdPool.
                        super_RefBase<vk::Handle<(vk::HandleType)24>_>);
  passCmd.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal =
       pHVar11->m_internal;
  ::vk::allocateCommandBuffer
            (&local_1d0,pDVar2,pVVar3,
             passCmd.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1b0,(Move *)&local_1d0);
  data_00.deleter.m_deviceIface = local_1b0.deleter.m_deviceIface;
  data_00.object = local_1b0.object;
  data_00.deleter.m_device = local_1b0.deleter.m_device;
  data_00.deleter.m_pool.m_internal = local_1b0.deleter.m_pool.m_internal;
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_190,data_00);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_1d0);
  if (((this->super_SingleTargetRenderInstance).field_0xf9 & 1) == 0) {
    pDVar2 = (this->super_SingleTargetRenderInstance).m_vki;
    pVVar3 = (this->super_SingleTargetRenderInstance).m_device;
    pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                        (&(this->super_SingleTargetRenderInstance).m_cmdPool.
                          super_RefBase<vk::Handle<(vk::HandleType)24>_>);
    fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)pHVar11->m_internal;
    ::vk::allocateCommandBuffer
              (&local_238,pDVar2,pVVar3,
               (VkCommandPool)
               fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator,
               VK_COMMAND_BUFFER_LEVEL_SECONDARY);
  }
  else {
    ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::Move(&local_238);
  }
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_218,(Move *)&local_238);
  data_01.deleter.m_deviceIface = local_218.deleter.m_deviceIface;
  data_01.object = local_218.object;
  data_01.deleter.m_device = local_218.deleter.m_device;
  data_01.deleter.m_pool.m_internal = local_218.deleter.m_pool.m_internal;
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_1f8,data_01);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_238);
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&infiniteTimeout,
                    (this->super_SingleTargetRenderInstance).m_vki,
                    (this->super_SingleTargetRenderInstance).m_device,0,(VkAllocationCallbacks *)0x0
                   );
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_280,(Move *)&infiniteTimeout);
  data_02.deleter.m_deviceIface = local_280.deleter.m_deviceIface;
  data_02.object.m_internal = local_280.object.m_internal;
  data_02.deleter.m_device = local_280.deleter.m_device;
  data_02.deleter.m_allocator = local_280.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)6>_> *)local_260,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)6>_> *)&infiniteTimeout);
  bVar1 = (this->super_SingleTargetRenderInstance).field_0xf9;
  pDVar2 = (this->super_SingleTargetRenderInstance).m_vki;
  ppVVar12 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_190);
  VVar8 = (*pDVar2->_vptr_DeviceInterface[0x49])
                    (pDVar2,*ppVVar12,&passCmdBufInheritInfo.pipelineStatistics);
  ::vk::checkResult(VVar8,"m_vki.beginCommandBuffer(*mainCmd, &mainCmdBufBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/binding_model/vktBindingShaderAccessTests.cpp"
                    ,0x4a4);
  pDVar2 = (this->super_SingleTargetRenderInstance).m_vki;
  ppVVar12 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_190);
  (*pDVar2->_vptr_DeviceInterface[0x74])(pDVar2,*ppVVar12,&pipelineLayout,(ulong)((byte)~bVar1 & 1))
  ;
  if (((this->super_SingleTargetRenderInstance).field_0xf9 & 1) == 0) {
    pDVar2 = (this->super_SingleTargetRenderInstance).m_vki;
    ppVVar12 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_1f8);
    VVar8 = (*pDVar2->_vptr_DeviceInterface[0x49])(pDVar2,*ppVVar12,(long)&clearValue + 8);
    ::vk::checkResult(VVar8,"m_vki.beginCommandBuffer(*passCmd, &passCmdBufBeginInfo)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/binding_model/vktBindingShaderAccessTests.cpp"
                      ,0x4ae);
    pDVar2 = (this->super_SingleTargetRenderInstance).m_vki;
    ppVVar12 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_1f8);
    pVVar4 = *ppVVar12;
    pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_118);
    submitInfo.pSignalSemaphores = (VkSemaphore *)pHVar13->m_internal;
    (*pDVar2->_vptr_DeviceInterface[0x4c])(pDVar2,pVVar4,0,submitInfo.pSignalSemaphores);
    ppVVar12 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_1f8);
    (*(this->super_SingleTargetRenderInstance).super_TestInstance._vptr_TestInstance[7])
              (this,*ppVVar12);
    pDVar2 = (this->super_SingleTargetRenderInstance).m_vki;
    ppVVar12 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_1f8);
    VVar8 = (*pDVar2->_vptr_DeviceInterface[0x4a])(pDVar2,*ppVVar12);
    ::vk::checkResult(VVar8,"m_vki.endCommandBuffer(*passCmd)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/binding_model/vktBindingShaderAccessTests.cpp"
                      ,0x4b1);
    pDVar2 = (this->super_SingleTargetRenderInstance).m_vki;
    ppVVar12 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_190);
    pVVar4 = *ppVVar12;
    ppVVar12 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_1f8);
    (*pDVar2->_vptr_DeviceInterface[0x77])(pDVar2,pVVar4,1,ppVVar12);
  }
  else {
    pDVar2 = (this->super_SingleTargetRenderInstance).m_vki;
    ppVVar12 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_190);
    pVVar4 = *ppVVar12;
    pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_118);
    (*pDVar2->_vptr_DeviceInterface[0x4c])(pDVar2,pVVar4,0,pHVar13->m_internal);
    ppVVar12 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_190);
    (*(this->super_SingleTargetRenderInstance).super_TestInstance._vptr_TestInstance[7])
              (this,*ppVVar12);
  }
  pDVar2 = (this->super_SingleTargetRenderInstance).m_vki;
  ppVVar12 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_190);
  (*pDVar2->_vptr_DeviceInterface[0x76])(pDVar2,*ppVVar12);
  pDVar2 = (this->super_SingleTargetRenderInstance).m_vki;
  ppVVar12 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_190);
  VVar8 = (*pDVar2->_vptr_DeviceInterface[0x4a])(pDVar2,*ppVVar12);
  ::vk::checkResult(VVar8,"m_vki.endCommandBuffer(*mainCmd)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/binding_model/vktBindingShaderAccessTests.cpp"
                    ,0x4b7);
  submitInfo.commandBufferCount = 0;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)0x0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  uStack_308 = 4;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x1;
  submitInfo._40_8_ =
       ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                 ((RefBase<vk::VkCommandBuffer_s_*> *)local_190);
  pDVar2 = (this->super_SingleTargetRenderInstance).m_vki;
  pVVar5 = (this->super_SingleTargetRenderInstance).m_queue;
  pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_260);
  VVar8 = (*pDVar2->_vptr_DeviceInterface[2])(pDVar2,pVVar5,1,&uStack_308,pHVar14->m_internal);
  ::vk::checkResult(VVar8,"m_vki.queueSubmit(m_queue, 1, &submitInfo, *fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/binding_model/vktBindingShaderAccessTests.cpp"
                    ,0x4c7);
  pDVar2 = (this->super_SingleTargetRenderInstance).m_vki;
  pVVar3 = (this->super_SingleTargetRenderInstance).m_device;
  pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::get
                      ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_260);
  VVar8 = (*pDVar2->_vptr_DeviceInterface[0x16])(pDVar2,pVVar3,1,pHVar14,0,0xffffffffffffffff);
  ::vk::checkResult(VVar8,"m_vki.waitForFences(m_device, 1, &fence.get(), 0u, infiniteTimeout)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/binding_model/vktBindingShaderAccessTests.cpp"
                    ,0x4c9);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)6>_> *)local_260);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_1f8);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_190);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_118);
  return;
}

Assistant:

void SingleCmdRenderInstance::renderToTarget (void)
{
	const vk::VkRect2D									renderArea						=
	{
		{ 0, 0 },								// offset
		{ m_targetSize.x(), m_targetSize.y() },	// extent
	};
	const vk::VkCommandBufferBeginInfo					mainCmdBufBeginInfo				=
	{
		vk::VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,
		DE_NULL,
		vk::VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT,	// flags
		(const vk::VkCommandBufferInheritanceInfo*)DE_NULL,
	};
	const vk::VkCommandBufferInheritanceInfo			passCmdBufInheritInfo			=
	{
		vk::VK_STRUCTURE_TYPE_COMMAND_BUFFER_INHERITANCE_INFO,
		DE_NULL,
		(vk::VkRenderPass)*m_renderPass,						// renderPass
		0u,														// subpass
		(vk::VkFramebuffer)*m_framebuffer,						// framebuffer
		VK_FALSE,												// occlusionQueryEnable
		(vk::VkQueryControlFlags)0,
		(vk::VkQueryPipelineStatisticFlags)0,
	};
	const vk::VkCommandBufferBeginInfo					passCmdBufBeginInfo				=
	{
		vk::VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,
		DE_NULL,
		vk::VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT |
		vk::VK_COMMAND_BUFFER_USAGE_RENDER_PASS_CONTINUE_BIT,	// flags
		&passCmdBufInheritInfo,
	};
	const vk::VkClearValue								clearValue					= vk::makeClearValueColorF32(0.0f, 0.0f, 0.0f, 0.0f);
	const vk::VkRenderPassBeginInfo						renderPassBeginInfo			=
	{
		vk::VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO,
		DE_NULL,
		*m_renderPass,		// renderPass
		*m_framebuffer,		// framebuffer
		renderArea,			// renderArea
		1u,					// clearValueCount
		&clearValue,		// pClearValues
	};

	const vk::VkPipelineLayout							pipelineLayout				(getPipelineLayout());
	const vk::Unique<vk::VkPipeline>					pipeline					(createPipeline(pipelineLayout));
	const vk::Unique<vk::VkCommandBuffer>				mainCmd						(vk::allocateCommandBuffer(m_vki, m_device, *m_cmdPool, vk::VK_COMMAND_BUFFER_LEVEL_PRIMARY));
	const vk::Unique<vk::VkCommandBuffer>				passCmd						((m_isPrimaryCmdBuf) ? (vk::Move<vk::VkCommandBuffer>()) : (vk::allocateCommandBuffer(m_vki, m_device, *m_cmdPool, vk::VK_COMMAND_BUFFER_LEVEL_SECONDARY)));
	const vk::Unique<vk::VkFence>						fence						(vk::createFence(m_vki, m_device));
	const deUint64										infiniteTimeout				= ~(deUint64)0u;
	const vk::VkSubpassContents							passContents				= (m_isPrimaryCmdBuf) ? (vk::VK_SUBPASS_CONTENTS_INLINE) : (vk::VK_SUBPASS_CONTENTS_SECONDARY_COMMAND_BUFFERS);

	VK_CHECK(m_vki.beginCommandBuffer(*mainCmd, &mainCmdBufBeginInfo));
	m_vki.cmdBeginRenderPass(*mainCmd, &renderPassBeginInfo, passContents);

	if (m_isPrimaryCmdBuf)
	{
		m_vki.cmdBindPipeline(*mainCmd, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
		writeDrawCmdBuffer(*mainCmd);
	}
	else
	{
		VK_CHECK(m_vki.beginCommandBuffer(*passCmd, &passCmdBufBeginInfo));
		m_vki.cmdBindPipeline(*passCmd, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
		writeDrawCmdBuffer(*passCmd);
		VK_CHECK(m_vki.endCommandBuffer(*passCmd));

		m_vki.cmdExecuteCommands(*mainCmd, 1, &passCmd.get());
	}

	m_vki.cmdEndRenderPass(*mainCmd);
	VK_CHECK(m_vki.endCommandBuffer(*mainCmd));

	// submit and wait for them to finish before exiting scope. (Killing in-flight objects is a no-no).
	{
		const vk::VkSubmitInfo	submitInfo	=
		{
			vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,
			DE_NULL,
			0u,
			(const vk::VkSemaphore*)0,
			(const vk::VkPipelineStageFlags*)DE_NULL,
			1u,
			&mainCmd.get(),
			0u,
			(const vk::VkSemaphore*)0,
		};
		VK_CHECK(m_vki.queueSubmit(m_queue, 1, &submitInfo, *fence));
	}
	VK_CHECK(m_vki.waitForFences(m_device, 1, &fence.get(), 0u, infiniteTimeout)); // \note: timeout is failure
}